

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O1

Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
MapLoader::loadMap_abi_cxx11_(MapLoader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  istream *piVar4;
  long *plVar5;
  long lVar6;
  char *pcVar7;
  ostream *poVar8;
  undefined8 uVar9;
  size_type *psVar10;
  char *__end;
  string newNeighbor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string nodeName;
  string nodeType;
  string line;
  ifstream input;
  int local_34c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_328
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  MapLoader *local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  istream local_238 [520];
  
  paVar1 = &local_348.field_2;
  local_2c0 = this;
  do {
    do {
      bVar2 = fileIsValid(this);
    } while (!bVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Setting up the game board...",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    local_328 = (Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)operator_new(0x18);
    Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Graph
              (local_328,this->nodeCount);
    std::ifstream::ifstream(local_238);
    std::ifstream::open((char *)local_238,(_Ios_Openmode)(this->filePath)._M_dataplus._M_p);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"","");
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"","");
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"","");
    local_34c = 0;
    while( true ) {
      piVar4 = std::operator>>(local_238,(string *)&local_2b8);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      iVar3 = std::__cxx11::string::compare((char *)&local_2b8);
      if (iVar3 == 0) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_300,0,(char *)local_300._M_string_length,0x11d455);
        std::__cxx11::string::_M_replace
                  ((ulong)&local_2e0,0,(char *)local_2e0._M_string_length,0x11d455);
        std::operator>>(local_238,(string *)&local_2b8);
        std::operator>>(local_238,(string *)&local_2b8);
        while( true ) {
          piVar4 = std::operator>>(local_238,(string *)&local_2b8);
          if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
          iVar3 = std::__cxx11::string::compare((char *)&local_2b8);
          if (iVar3 == 0) break;
          std::operator+(&local_320,&local_300,&local_2b8);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_320);
          psVar10 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_348.field_2._M_allocated_capacity = *psVar10;
            local_348.field_2._8_8_ = plVar5[3];
            local_348._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_348.field_2._M_allocated_capacity = *psVar10;
            local_348._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_348._M_string_length = plVar5[1];
          *plVar5 = (long)psVar10;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_300,(string *)&local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != paVar1) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_dataplus._M_p != &local_320.field_2) {
            operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
          }
        }
LAB_00115ec9:
        piVar4 = std::operator>>(local_238,(string *)&local_2b8);
        if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
          iVar3 = std::__cxx11::string::compare((char *)&local_2b8);
          if (iVar3 == 0) goto LAB_00115efa;
          std::operator+(&local_348,&local_2e0,&local_2b8);
          std::__cxx11::string::operator=((string *)&local_2e0,(string *)&local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != paVar1) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00115ec9;
        }
LAB_00115efa:
        lVar6 = std::__cxx11::string::find_last_not_of
                          ((char *)&local_300,0x11d451,0xffffffffffffffff);
        pcVar7 = (char *)(lVar6 + 1);
        if (local_300._M_string_length < pcVar7) {
LAB_0011642c:
          uVar9 = std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                             "basic_string::erase",pcVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_300._M_dataplus._M_p != &local_300.field_2) {
            operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          std::ifstream::~ifstream(local_238);
          _Unwind_Resume(uVar9);
        }
        local_300._M_dataplus._M_p[(long)pcVar7] = '\0';
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        local_300._M_string_length = (size_type)pcVar7;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_258,local_300._M_dataplus._M_p,
                   pcVar7 + (long)local_300._M_dataplus._M_p);
        Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        setVertexName(local_328,&local_258,local_34c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"adding vertex name",0x12);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_300._M_dataplus._M_p,
                            local_300._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,local_2e0._M_dataplus._M_p,
                   (char *)(local_2e0._M_string_length + (long)local_2e0._M_dataplus._M_p));
        Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        setVertexData(local_328,&local_278,local_34c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"adding vertex data",0x12);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_2e0._M_dataplus._M_p,
                            local_2e0._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        local_348._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"");
        while( true ) {
          piVar4 = std::operator>>(local_238,(string *)&local_2b8);
          if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
          iVar3 = std::__cxx11::string::compare((char *)&local_2b8);
          if (iVar3 == 0) break;
          iVar3 = std::__cxx11::string::compare((char *)&local_2b8);
          if (iVar3 == 0) {
            lVar6 = std::__cxx11::string::find_last_not_of
                              ((char *)&local_348,0x11d451,0xffffffffffffffff);
            pcVar7 = (char *)(lVar6 + 1);
            if (local_348._M_string_length < pcVar7) {
              pcVar7 = (char *)std::__throw_out_of_range_fmt
                                         ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                          "basic_string::erase",pcVar7);
              goto LAB_0011642c;
            }
            local_348._M_dataplus._M_p[(long)pcVar7] = '\0';
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
            local_348._M_string_length = (size_type)pcVar7;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_298,local_348._M_dataplus._M_p,
                       pcVar7 + (long)local_348._M_dataplus._M_p);
            Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::addNeighbor(local_328,&local_298,local_34c);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1
                             );
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"adding neighbor",0xf);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_348._M_dataplus._M_p,
                                local_348._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            std::__cxx11::string::_M_replace
                      ((ulong)&local_348,0,(char *)local_348._M_string_length,0x11d455);
          }
          else {
            local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_320,local_2b8._M_dataplus._M_p,
                       local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
            std::__cxx11::string::append((char *)&local_320);
            std::__cxx11::string::_M_append((char *)&local_348,(ulong)local_320._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_320._M_dataplus._M_p != &local_320.field_2) {
              operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != paVar1) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        local_34c = local_34c + 1;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Graph --------------------------------",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    toString(&local_348,local_328);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_348._M_dataplus._M_p,local_348._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != paVar1) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    local_2c0->map = local_328;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    std::ifstream::~ifstream(local_238);
    this = local_2c0;
    if (bVar2) {
      return local_2c0->map;
    }
  } while( true );
}

Assistant:

Graph<string>* MapLoader::loadMap()
{
  //method to load the map file into a graph object

  bool result = false;

  while(!result)
  {

    if(fileIsValid())
    {
      //if the file was valid then we set up the graph object by reading all of the data in the file and assigning nodes
      cout << "Setting up the game board..." << endl;

      Graph<string>* graph = new Graph<string>(nodeCount);

      //we need to reopen the file

      ifstream input; //the input stream associated to out file
      input.open(filePath.c_str()); //try opening the file

      //we already know it is valid so we can start reading right away
      string line = "";
      string nodeName = "";
      string nodeType = "";
      int graphIndex = 0;

      //while we still have readable lines
      while(input >> line)
      {
        //first get the name of the node
        if(line == "@node")
        {
          //wipe the nodeName and nodeType clean
          nodeName = "";
          nodeType = "";

          //if the line is the node declaration
          //then go to the next line and the line after that, where the name field is
          input >> line;
          input >> line;

          //now that we are at the name field we read until we hit adjacent node
          while(input >> line && line != "type:")
          {
            nodeName = nodeName + line + " ";
          }

          //now we need to get the type of node that it is
          while(input >> line && line != "adjacent:")
          {
            nodeType = nodeType + line;
          }

          //since we add a space at the end, we need to trim the right side
          nodeName.erase(nodeName.find_last_not_of(" \n\r\t")+1);
          //now that we have the name of the node, we need to add it to our graph
          graph -> setVertexName(nodeName, graphIndex);
          cout << "adding vertex name" << nodeName << endl;
          graph -> setVertexData(nodeType, graphIndex);
          cout << "adding vertex data" << nodeType << endl;

          //now that we have added the name of the node we need to add every node it is adjacent to to its adjacency list

          string newNeighbor = ""; //the string that will hold the name of the new neighbor to the node

          //while we have not reached a closing brace, keep reading
          while(input >> line && line != "}")
          {
            //if the line contains the word adjacent, then skip that word
            if(line == "adjacent:")
            {
              newNeighbor.erase(newNeighbor.find_last_not_of(" \n\r\t")+1);
              graph -> addNeighbor(newNeighbor, graphIndex); //add the new neighbor
              cout << "adding neighbor" << newNeighbor << endl;
              newNeighbor = ""; //wipe the newNeighbor field and then continue the iteration
              continue;
            }

            else
            {
              newNeighbor += line + " ";
            }
          }

          graphIndex++;
        }
      }
      cout << "Graph --------------------------------" << endl;
      cout << graph->toString() << endl;
      map = graph;
      result = true;
    }

    else
    {
      //if the file was not valid then we need to try again
      result = false;
    }
  }

  return map;

}